

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O2

void __thiscall
Assimp::ZipArchiveIOSystem::Implement::getFileListExtension
          (Implement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rFileList,string *extension)

{
  __type _Var1;
  _Base_ptr p_Var2;
  string local_50;
  
  MapArchive(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(rFileList);
  for (p_Var2 = (this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    BaseImporter::GetExtension(&local_50,(string *)(p_Var2 + 1));
    _Var1 = std::operator==(extension,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(rFileList,(value_type *)(p_Var2 + 1));
    }
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::getFileListExtension(std::vector<std::string>& rFileList, const std::string& extension) {
        MapArchive();
        rFileList.clear();

        for (const auto &file : m_ArchiveMap) {
            if (extension == BaseImporter::GetExtension(file.first))
                rFileList.push_back(file.first);
        }
    }